

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void testComp(string *tempdir,exr_compression_t comp)

{
  pixels p;
  pixels local_d0;
  
  pixels::pixels(&local_d0,0x55b,0x9f,0x560);
  pixels::fillZero(&local_d0);
  testWriteRead(&local_d0,tempdir,comp,"zeroes");
  pixels::fillPattern1(&local_d0);
  testWriteRead(&local_d0,tempdir,comp,"pattern1");
  pixels::fillPattern2(&local_d0);
  testWriteRead(&local_d0,tempdir,comp,"pattern2");
  pixels::fillRandom(&local_d0);
  testWriteRead(&local_d0,tempdir,comp,"random");
  pixels::~pixels(&local_d0);
  return;
}

Assistant:

static void
testComp (const std::string& tempdir, exr_compression_t comp)
{
    pixels p{IMG_WIDTH, IMG_HEIGHT, IMG_STRIDE_X};

    p.fillZero ();
    testWriteRead (p, tempdir, comp, "zeroes");
    p.fillPattern1 ();
    testWriteRead (p, tempdir, comp, "pattern1");
    p.fillPattern2 ();
    testWriteRead (p, tempdir, comp, "pattern2");
    p.fillRandom ();
    testWriteRead (p, tempdir, comp, "random");
}